

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batchnorm.cpp
# Opt level: O1

void __thiscall ncnn::BatchNorm::BatchNorm(BatchNorm *this)

{
  Layer::Layer(&this->super_Layer);
  (this->super_Layer)._vptr_Layer = (_func_int **)&PTR__BatchNorm_0013b748;
  memset(&this->slope_data,0,0x120);
  (this->super_Layer).one_blob_only = true;
  (this->super_Layer).support_inplace = true;
  return;
}

Assistant:

BatchNorm::BatchNorm()
{
    one_blob_only = true;
    support_inplace = true;
}